

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecompiler.cpp
# Opt level: O2

Error __thiscall
asmjit::CodeCompiler::_newConst(CodeCompiler *this,Mem *out,uint32_t scope,void *data,size_t size)

{
  uint32_t uVar1;
  uint32_t in_EAX;
  Error EVar2;
  CBConstPool *pCVar3;
  long lVar4;
  Error EStack_40;
  size_t off;
  
  if (scope == 0) {
    lVar4 = 0x1c8;
  }
  else {
    if (scope != 1) {
      EStack_40 = 3;
      goto LAB_00152ca5;
    }
    lVar4 = 0x1d0;
  }
  pCVar3 = *(CBConstPool **)
            ((long)&(this->super_CodeBuilder).super_CodeEmitter._vptr_CodeEmitter + lVar4);
  off._0_4_ = in_EAX;
  if (pCVar3 == (CBConstPool *)0x0) {
    pCVar3 = CodeBuilder::newConstPool(&this->super_CodeBuilder);
    *(CBConstPool **)((long)&(this->super_CodeBuilder).super_CodeEmitter._vptr_CodeEmitter + lVar4)
         = pCVar3;
    if (pCVar3 == (CBConstPool *)0x0) {
      EStack_40 = 1;
LAB_00152ca5:
      EVar2 = CodeEmitter::setLastError((CodeEmitter *)this,EStack_40,(char *)0x0);
      return EVar2;
    }
  }
  EVar2 = ConstPool::add(&pCVar3->_constPool,data,size,&off);
  if (EVar2 == 0) {
    uVar1 = (pCVar3->super_CBLabel)._id;
    (out->super_Operand).super_Operand_.field_0._packed[0] =
         (UInt64)((ulong)(uint)((int)size << 0x18) | 0xffffffff0000000a);
    (out->super_Operand).super_Operand_.field_0._any.reserved8_4 = (uint32_t)off;
    (out->super_Operand).super_Operand_.field_0._any.reserved12_4 = uVar1;
    EVar2 = 0;
  }
  else {
    EVar2 = CodeEmitter::setLastError((CodeEmitter *)this,EVar2,(char *)0x0);
  }
  return EVar2;
}

Assistant:

Error CodeCompiler::_newConst(Mem& out, uint32_t scope, const void* data, size_t size) {
  CBConstPool** pPool;
  if (scope == kConstScopeLocal)
    pPool = &_localConstPool;
  else if (scope == kConstScopeGlobal)
    pPool = &_globalConstPool;
  else
    return setLastError(DebugUtils::errored(kErrorInvalidArgument));

  if (!*pPool && !(*pPool = newConstPool()))
    return setLastError(DebugUtils::errored(kErrorNoHeapMemory));

  CBConstPool* pool = *pPool;
  size_t off;

  Error err = pool->add(data, size, off);
  if (ASMJIT_UNLIKELY(err)) return setLastError(err);

  out = Mem(Init,
    Label::kLabelTag,             // Base type.
    pool->getId(),                // Base id.
    0,                            // Index type.
    kInvalidValue,                // Index id.
    static_cast<int32_t>(off),    // Offset.
    static_cast<uint32_t>(size),  // Size.
    0);                           // Flags.
  return kErrorOk;
}